

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-stream.c
# Opt level: O1

cc_bool ResizeIfNeeded(MemoryStream *memory_stream,size_t minimum_needed_size)

{
  ulong uVar1;
  ulong __size;
  uchar *puVar2;
  
  if (memory_stream->size < minimum_needed_size) {
    uVar1 = 1;
    do {
      __size = uVar1;
      uVar1 = __size * 2;
    } while (__size < minimum_needed_size);
    puVar2 = (uchar *)realloc(memory_stream->buffer,__size);
    if (puVar2 == (uchar *)0x0) {
      return '\0';
    }
    memory_stream->buffer = puVar2;
    memset(puVar2 + memory_stream->size,0,__size - memory_stream->size);
    memory_stream->size = __size;
  }
  if (memory_stream->end < minimum_needed_size) {
    memory_stream->end = minimum_needed_size;
  }
  return '\x01';
}

Assistant:

static cc_bool ResizeIfNeeded(MemoryStream* const memory_stream, const size_t minimum_needed_size)
{
	if (minimum_needed_size > memory_stream->size)
	{
		unsigned char *buffer;

		size_t new_size = 1;
		while (new_size < minimum_needed_size)
			new_size <<= 1;

		buffer = (unsigned char*)realloc(memory_stream->buffer, new_size);

		if (buffer == NULL)
			return cc_false;

		memory_stream->buffer = buffer;
		memset(memory_stream->buffer + memory_stream->size, 0, new_size - memory_stream->size);
		memory_stream->size = new_size;
	}

	if (minimum_needed_size > memory_stream->end)
		memory_stream->end = minimum_needed_size;

	return cc_true;
}